

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_context
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,char delim,size_t max_splits)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  runtime_error *this;
  bool local_de;
  bool local_dd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  value_type_conflict local_79 [23];
  value_type_conflict local_62;
  bool local_61;
  ulong uStack_60;
  bool in_quoted_string;
  size_t last_start;
  size_t z;
  undefined1 local_48 [7];
  bool char_is_escaped;
  vector<char,_std::allocator<char>_> paren_stack;
  size_t max_splits_local;
  char delim_local;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48);
  z._7_1_ = 0;
  uStack_60 = 0;
  last_start = 0;
  do {
    sVar2 = last_start;
    sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (s);
    if (sVar4 <= sVar2) {
      if (uStack_60 <= last_start) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_c0,s,uStack_60,0xffffffffffffffff);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_c0);
        ::std::__cxx11::string::~string((string *)&local_c0);
      }
      sVar7 = ::std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_48);
      if (sVar7 == 0) {
        paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
        ::std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_48);
        if ((paren_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this,"unbalanced parentheses in split_context");
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((z._7_1_ & 1) != 0) ||
       (bVar3 = ::std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)local_48), bVar3)) {
LAB_0010b4da:
      bVar3 = ::std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)local_48);
      local_dd = false;
      if (!bVar3) {
        pvVar6 = ::std::vector<char,_std::allocator<char>_>::back
                           ((vector<char,_std::allocator<char>_> *)local_48);
        local_de = true;
        if (*pvVar6 != '\'') {
          pvVar6 = ::std::vector<char,_std::allocator<char>_>::back
                             ((vector<char,_std::allocator<char>_> *)local_48);
          local_de = *pvVar6 == '\"';
        }
        local_dd = local_de;
      }
      local_61 = local_dd;
      if ((z._7_1_ & 1) == 0) {
        if ((local_dd != false) &&
           (pvVar5 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (s,last_start), *pvVar5 == '\\')) {
          z._7_1_ = 1;
        }
      }
      else {
        z._7_1_ = 0;
      }
      if ((local_61 & 1U) == 0) {
        pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,last_start);
        if (*pvVar5 == '(') {
          local_62 = ')';
          ::std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)local_48,&local_62);
        }
        else {
          pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,last_start);
          if (*pvVar5 == '[') {
            local_79[4] = 0x5d;
            ::std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)local_48,local_79 + 4);
          }
          else {
            pvVar5 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (s,last_start);
            if (*pvVar5 == '{') {
              local_79[3] = 0x7d;
              ::std::vector<char,_std::allocator<char>_>::push_back
                        ((vector<char,_std::allocator<char>_> *)local_48,local_79 + 3);
            }
            else {
              pvVar5 = ::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (s,last_start);
              if (*pvVar5 == '<') {
                local_79[2] = 0x3e;
                ::std::vector<char,_std::allocator<char>_>::push_back
                          ((vector<char,_std::allocator<char>_> *)local_48,local_79 + 2);
              }
              else {
                pvVar5 = ::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](s,last_start);
                if (*pvVar5 == '\'') {
                  local_79[1] = 0x27;
                  ::std::vector<char,_std::allocator<char>_>::push_back
                            ((vector<char,_std::allocator<char>_> *)local_48,local_79 + 1);
                }
                else {
                  pvVar5 = ::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           operator[](s,last_start);
                  if (*pvVar5 == '\"') {
                    local_79[0] = '\"';
                    ::std::vector<char,_std::allocator<char>_>::push_back
                              ((vector<char,_std::allocator<char>_> *)local_48,local_79);
                  }
                  else {
                    bVar3 = ::std::vector<char,_std::allocator<char>_>::empty
                                      ((vector<char,_std::allocator<char>_> *)local_48);
                    if (((bVar3) &&
                        (pvVar5 = ::std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::operator[](s,last_start), *pvVar5 == delim)) &&
                       ((max_splits == 0 ||
                        (sVar7 = ::std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size(__return_storage_ptr__), sVar7 < max_splits)))) {
                      ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                (&local_a0,s,uStack_60,last_start - uStack_60);
                      ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(__return_storage_ptr__,&local_a0);
                      ::std::__cxx11::string::~string((string *)&local_a0);
                      uStack_60 = last_start + 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,last_start);
      cVar1 = *pvVar5;
      pvVar6 = ::std::vector<char,_std::allocator<char>_>::back
                         ((vector<char,_std::allocator<char>_> *)local_48);
      if (cVar1 != *pvVar6) goto LAB_0010b4da;
      ::std::vector<char,_std::allocator<char>_>::pop_back
                ((vector<char,_std::allocator<char>_> *)local_48);
    }
    last_start = last_start + 1;
  } while( true );
}

Assistant:

vector<string> split_context(const string& s, char delim, size_t max_splits) {
  vector<string> ret;
  vector<char> paren_stack;
  bool char_is_escaped = false;

  size_t z, last_start = 0;
  for (z = 0; z < s.size(); z++) {
    if (!char_is_escaped && !paren_stack.empty() && (s[z] == paren_stack.back())) {
      paren_stack.pop_back();
      continue;
    }
    bool in_quoted_string = (!paren_stack.empty() && ((paren_stack.back() == '\'') || (paren_stack.back() == '\"')));
    if (char_is_escaped) {
      char_is_escaped = false;
    } else if (in_quoted_string && s[z] == '\\') {
      char_is_escaped = true;
    }
    if (!in_quoted_string) {
      if (s[z] == '(') {
        paren_stack.push_back(')');
      } else if (s[z] == '[') {
        paren_stack.push_back(']');
      } else if (s[z] == '{') {
        paren_stack.push_back('}');
      } else if (s[z] == '<') {
        paren_stack.push_back('>');
      } else if (s[z] == '\'') {
        paren_stack.push_back('\'');
      } else if (s[z] == '\"') {
        paren_stack.push_back('\"');
      } else if (paren_stack.empty() && (s[z] == delim) && (!max_splits || (ret.size() < max_splits))) {
        ret.push_back(s.substr(last_start, z - last_start));
        last_start = z + 1;
      }
    }
  }

  if (z >= last_start) {
    ret.push_back(s.substr(last_start));
  }

  if (paren_stack.size()) {
    throw runtime_error("unbalanced parentheses in split_context");
  }

  return ret;
}